

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

word Sfm_LibTruth6Two(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  uint nVars;
  ulong uVar4;
  long lVar5;
  word wVar6;
  word uFanins [8];
  word local_58 [8];
  
  wVar1 = Exp_Truth6(*(uint *)&pCellBot->field_0x10 >> 0x1c,pCellBot->vExpr,(word *)0x0);
  if (-1 < InTop) {
    nVars = *(uint *)&pCellTop->field_0x10 >> 0x1c;
    if ((uint)InTop < nVars) {
      uVar2 = *(uint *)&pCellBot->field_0x10 >> 0x1c;
      uVar3 = uVar2;
      for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
        wVar6 = wVar1;
        if ((uint)InTop != uVar4) {
          lVar5 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          wVar6 = s_Truths6[lVar5];
        }
        local_58[uVar4] = wVar6;
      }
      if (uVar2 + nVars != uVar3 + 1) {
        __assert_fail("(int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                      ,0x106,"word Sfm_LibTruth6Two(Mio_Cell2_t *, Mio_Cell2_t *, int)");
      }
      wVar1 = Exp_Truth6(nVars,pCellTop->vExpr,local_58);
      return wVar1;
    }
  }
  __assert_fail("InTop >= 0 && InTop < (int)pCellTop->nFanins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                ,0x100,"word Sfm_LibTruth6Two(Mio_Cell2_t *, Mio_Cell2_t *, int)");
}

Assistant:

word Sfm_LibTruth6Two( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    word uFanins[SFM_SUPP_MAX]; int i, k;
    word uTruthBot = Exp_Truth6( pCellBot->nFanins, pCellBot->vExpr, NULL );
    assert( InTop >= 0 && InTop < (int)pCellTop->nFanins );
    for ( i = 0, k = pCellBot->nFanins; i < (int)pCellTop->nFanins; i++ )
        if ( i == InTop )
            uFanins[i] = uTruthBot;
        else
            uFanins[i] = s_Truths6[k++];
    assert( (int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1 );
    uTruthBot = Exp_Truth6( pCellTop->nFanins, pCellTop->vExpr, uFanins );
    return uTruthBot;
}